

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeInfo.cpp
# Opt level: O3

void __thiscall TypeInfo::inform_symbol(TypeInfo *this,string *name,TypeSpec *type)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  iterator iVar3;
  undefined8 uVar4;
  TypeSpec local_50;
  
  inform_symbol_with_no_type_info(this,name);
  iVar3 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GoalSymbol>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GoalSymbol>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&(this->m_symbols)._M_h,name);
  if (iVar3.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GoalSymbol>,_true>
      ._M_cur != (__node_type *)0x0) {
    paVar2 = &local_50.m_base_type.field_2;
    local_50.m_base_type._M_dataplus._M_p = (type->m_base_type)._M_dataplus._M_p;
    paVar1 = &(type->m_base_type).field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50.m_base_type._M_dataplus._M_p == paVar1) {
      local_50.m_base_type.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
      local_50.m_base_type.field_2._8_8_ = *(undefined8 *)((long)&(type->m_base_type).field_2 + 8);
      local_50.m_base_type._M_dataplus._M_p = (pointer)paVar2;
    }
    else {
      local_50.m_base_type.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    }
    local_50.m_base_type._M_string_length = (type->m_base_type)._M_string_length;
    (type->m_base_type)._M_dataplus._M_p = (pointer)paVar1;
    (type->m_base_type)._M_string_length = 0;
    (type->m_base_type).field_2._M_local_buf[0] = '\0';
    local_50.m_args.super__Vector_base<TypeSpec,_std::allocator<TypeSpec>_>._M_impl.
    super__Vector_impl_data._M_start =
         (type->m_args).super__Vector_base<TypeSpec,_std::allocator<TypeSpec>_>._M_impl.
         super__Vector_impl_data._M_start;
    local_50.m_args.super__Vector_base<TypeSpec,_std::allocator<TypeSpec>_>._M_impl.
    super__Vector_impl_data._M_finish =
         (type->m_args).super__Vector_base<TypeSpec,_std::allocator<TypeSpec>_>._M_impl.
         super__Vector_impl_data._M_finish;
    local_50.m_args.super__Vector_base<TypeSpec,_std::allocator<TypeSpec>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (type->m_args).super__Vector_base<TypeSpec,_std::allocator<TypeSpec>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    (type->m_args).super__Vector_base<TypeSpec,_std::allocator<TypeSpec>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (type->m_args).super__Vector_base<TypeSpec,_std::allocator<TypeSpec>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (type->m_args).super__Vector_base<TypeSpec,_std::allocator<TypeSpec>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    GoalSymbol::set_type
              ((GoalSymbol *)
               ((long)iVar3.
                      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GoalSymbol>,_true>
                      ._M_cur + 0x28),&local_50);
    std::vector<TypeSpec,_std::allocator<TypeSpec>_>::~vector(&local_50.m_args);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50.m_base_type._M_dataplus._M_p != paVar2) {
      operator_delete(local_50.m_base_type._M_dataplus._M_p,
                      local_50.m_base_type.field_2._M_allocated_capacity + 1);
    }
    return;
  }
  uVar4 = std::__throw_out_of_range("_Map_base::at");
  TypeSpec::~TypeSpec(&local_50);
  _Unwind_Resume(uVar4);
}

Assistant:

void TypeInfo::inform_symbol(const std::string &name, TypeSpec type) {
  inform_symbol_with_no_type_info(name);
  m_symbols.at(name).set_type(std::move(type));
}